

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DwaCompressor::relevantChannelRules
          (DwaCompressor *this,
          vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
          *rules)

{
  size_type sVar1;
  const_reference pvVar2;
  long lVar3;
  string *psVar4;
  value_type *__x;
  long in_RDI;
  size_t cd_1;
  size_t i;
  size_t lastDot;
  string suffix;
  size_t cd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  suffixes;
  value_type *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  ulong uVar5;
  ulong __n;
  string *psVar6;
  string *suffix_00;
  Classifier *in_stack_ffffffffffffff78;
  string local_50 [32];
  ulong local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  std::
  vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>::
  clear((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
         *)0x1cf2c1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1cf2ce);
  local_30 = 0;
  while( true ) {
    uVar5 = local_30;
    sVar1 = std::
            vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
            ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60));
    if (sVar1 <= uVar5) break;
    pvVar2 = std::
             vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
             ::operator[]((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                           *)(in_RDI + 0x60),local_30);
    std::__cxx11::string::string(local_50,(string *)pvVar2);
    lVar3 = std::__cxx11::string::find_last_of((char)local_50,0x2e);
    if (lVar3 != -1) {
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffff78,(ulong)local_50);
      std::__cxx11::string::operator=(local_50,(string *)&stack0xffffffffffffff78);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_50);
    local_30 = local_30 + 1;
  }
  psVar6 = (string *)0x0;
  do {
    suffix_00 = psVar6;
    psVar4 = (string *)
             std::
             vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
             ::size((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                     *)(in_RDI + 0x90));
    if (psVar4 <= psVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
      return;
    }
    uVar5 = 0;
    while( true ) {
      __n = uVar5;
      sVar1 = std::
              vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
              ::size((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                      *)(in_RDI + 0x60));
      if (sVar1 <= uVar5) break;
      std::
      vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
      ::operator[]((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                    *)(in_RDI + 0x90),(size_type)suffix_00);
      __x = (value_type *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_28,__n);
      std::
      vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
      ::operator[]((vector<Imf_3_2::DwaCompressor::ChannelData,_std::allocator<Imf_3_2::DwaCompressor::ChannelData>_>
                    *)(in_RDI + 0x60),__n);
      in_stack_ffffffffffffff47 =
           Classifier::match(in_stack_ffffffffffffff78,suffix_00,(PixelType)(__n >> 0x20));
      if ((bool)in_stack_ffffffffffffff47) {
        std::
        vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
        ::operator[]((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                      *)(in_RDI + 0x90),(size_type)suffix_00);
        std::
        vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
        ::push_back((vector<Imf_3_2::DwaCompressor::Classifier,_std::allocator<Imf_3_2::DwaCompressor::Classifier>_>
                     *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),__x);
        break;
      }
      uVar5 = __n + 1;
    }
    psVar6 = (string *)&suffix_00->field_0x1;
  } while( true );
}

Assistant:

void
DwaCompressor::relevantChannelRules (std::vector<Classifier>& rules) const
{
    rules.clear ();

    std::vector<std::string> suffixes;

    for (size_t cd = 0; cd < _channelData.size (); ++cd)
    {
        std::string suffix  = _channelData[cd].name;
        size_t      lastDot = suffix.find_last_of ('.');

        if (lastDot != std::string::npos)
            suffix = suffix.substr (lastDot + 1, std::string::npos);

        suffixes.push_back (suffix);
    }

    for (size_t i = 0; i < _channelRules.size (); ++i)
    {
        for (size_t cd = 0; cd < _channelData.size (); ++cd)
        {
            if (_channelRules[i].match (suffixes[cd], _channelData[cd].type))
            {
                rules.push_back (_channelRules[i]);
                break;
            }
        }
    }
}